

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O3

char * fsg_search_hyp(ps_search_t *search,int32 *out_score)

{
  uint uVar1;
  dict_t *d;
  dictword_t *pdVar2;
  char *__s;
  int id;
  s3wid_t sVar3;
  ps_lattice_t *dag;
  ps_latlink_t *link;
  char *pcVar4;
  fsg_hist_entry_t *pfVar5;
  size_t sVar6;
  int backward;
  long lVar7;
  int id_00;
  size_t elem_size;
  
  d = search->dict;
  id = fsg_search_find_exit
                 ((fsg_search_t *)search,search[1].post,(uint)(byte)search[1].n_words,out_score);
  if (0 < id) {
    if ((*(char *)((long)&search[1].n_words + 1) != '\0') && ((char)search[1].n_words != '\0')) {
      dag = fsg_search_lattice(search);
      if (dag == (ps_lattice_t *)0x0) {
        pcVar4 = "Failed to obtain the lattice while bestpath enabled\n";
        lVar7 = 1000;
      }
      else {
        link = fsg_search_bestpath(search,out_score,backward);
        if (link != (ps_latlink_t *)0x0) {
          pcVar4 = ps_lattice_hyp(dag,link);
          return pcVar4;
        }
        pcVar4 = "Failed to find the bestpath in a lattice\n";
        lVar7 = 0x3ec;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,lVar7,pcVar4);
      return (char *)0x0;
    }
    elem_size = 0;
    id_00 = id;
    do {
      pfVar5 = fsg_history_entry_get((fsg_history_t *)search[1].pls,id_00);
      id_00 = pfVar5->pred;
      uVar1 = pfVar5->fsglink->wid;
      if (-1 < (int)uVar1) {
        lVar7 = *(long *)(search[1].type + 0x20);
        if ((lVar7 == 0) ||
           ((*(uint *)(lVar7 + (ulong)(uVar1 >> 5) * 4) >> (uVar1 & 0x1f) & 1) == 0)) {
          pdVar2 = d->word;
          sVar3 = dict_wordid(d,*(char **)(*(long *)(search[1].type + 0x18) + (ulong)uVar1 * 8));
          sVar6 = strlen(pdVar2[pdVar2[sVar3].basewid].word);
          elem_size = elem_size + sVar6 + 1;
        }
      }
    } while (0 < id_00);
    ckd_free(search->hyp_str);
    if (elem_size != 0) {
      pcVar4 = (char *)__ckd_calloc__(1,elem_size,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                                      ,0x409);
      search->hyp_str = pcVar4;
      pcVar4 = pcVar4 + (elem_size - 1);
      do {
        pfVar5 = fsg_history_entry_get((fsg_history_t *)search[1].pls,id);
        id = pfVar5->pred;
        uVar1 = pfVar5->fsglink->wid;
        if (-1 < (int)uVar1) {
          lVar7 = *(long *)(search[1].type + 0x20);
          if ((lVar7 == 0) ||
             ((*(uint *)(lVar7 + (ulong)(uVar1 >> 5) * 4) >> (uVar1 & 0x1f) & 1) == 0)) {
            pdVar2 = d->word;
            sVar3 = dict_wordid(d,*(char **)(*(long *)(search[1].type + 0x18) + (ulong)uVar1 * 8));
            __s = pdVar2[pdVar2[sVar3].basewid].word;
            sVar6 = strlen(__s);
            pcVar4 = pcVar4 + -sVar6;
            memcpy(pcVar4,__s,sVar6);
            if (search->hyp_str < pcVar4) {
              pcVar4[-1] = ' ';
              pcVar4 = pcVar4 + -1;
            }
          }
        }
      } while (0 < id);
      return search->hyp_str;
    }
    search->hyp_str = (char *)0x0;
  }
  return (char *)0x0;
}

Assistant:

char const *
fsg_search_hyp(ps_search_t *search, int32 *out_score)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;
    dict_t *dict = ps_search_dict(search);
    char *c;
    size_t len;
    int bp, bpidx;

    /* Get last backpointer table index. */
    bpidx = fsg_search_find_exit(fsgs, fsgs->frame, fsgs->final, out_score);
    /* No hypothesis (yet). */
    if (bpidx <= 0) {
        return NULL;
    }

    /* If bestpath is enabled and the utterance is complete, then run it.
     * Note that setting bestpath in fsg_search_init is disabled by default. */
    if (fsgs->bestpath && fsgs->final) {
        ps_lattice_t *dag;
        ps_latlink_t *link;

        if ((dag = fsg_search_lattice(search)) == NULL) {
    	    E_WARN("Failed to obtain the lattice while bestpath enabled\n");
            return NULL;
        }
        if ((link = fsg_search_bestpath(search, out_score, FALSE)) == NULL) {
    	    E_WARN("Failed to find the bestpath in a lattice\n");
            return NULL;
        }
        return ps_lattice_hyp(dag, link);
    }

    bp = bpidx;
    len = 0;
    while (bp > 0) {
        fsg_hist_entry_t *hist_entry = fsg_history_entry_get(fsgs->history, bp);
        fsg_link_t *fl = fsg_hist_entry_fsglink(hist_entry);
        char const *baseword;
        int32 wid;

        bp = fsg_hist_entry_pred(hist_entry);
        wid = fsg_link_wid(fl);
        if (wid < 0 || fsg_model_is_filler(fsgs->fsg, wid))
            continue;
        baseword = dict_basestr(dict,
                                dict_wordid(dict,
                                            fsg_model_word_str(fsgs->fsg, wid)));
        len += strlen(baseword) + 1;
    }
    
    ckd_free(search->hyp_str);
    if (len == 0) {
	search->hyp_str = NULL;
	return search->hyp_str;
    }
    search->hyp_str = ckd_calloc(1, len);

    bp = bpidx;
    c = search->hyp_str + len - 1;
    while (bp > 0) {
        fsg_hist_entry_t *hist_entry = fsg_history_entry_get(fsgs->history, bp);
        fsg_link_t *fl = fsg_hist_entry_fsglink(hist_entry);
        char const *baseword;
        int32 wid;

        bp = fsg_hist_entry_pred(hist_entry);
        wid = fsg_link_wid(fl);
        if (wid < 0 || fsg_model_is_filler(fsgs->fsg, wid))
            continue;
        baseword = dict_basestr(dict,
                                dict_wordid(dict,
                                            fsg_model_word_str(fsgs->fsg, wid)));
        len = strlen(baseword);
        c -= len;
        memcpy(c, baseword, len);
        if (c > search->hyp_str) {
            --c;
            *c = ' ';
        }
    }

    return search->hyp_str;
}